

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleHandlers_Test::testBody
          (TEST_MockNamedValueHandlerRepository_installMultipleHandlers_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueComparator *pMVar2;
  TestTerminator *pTVar3;
  MockNamedValueCopier *pMVar4;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator3;
  TypeForTestingExpectedFunctionCallComparator comparator2;
  TypeForTestingExpectedFunctionCallComparator comparator1;
  TypeForTestingExpectedFunctionCallCopier copier3;
  TypeForTestingExpectedFunctionCallCopier copier2;
  TypeForTestingExpectedFunctionCallCopier copier1;
  SimpleString local_60;
  MockNamedValueComparatorsAndCopiersRepository local_50;
  MockNamedValueComparator local_40;
  MockNamedValueComparator local_38;
  MockNamedValueComparator local_30;
  MockNamedValueCopier local_28;
  MockNamedValueCopier local_20;
  MockNamedValueCopier local_18;
  
  local_18._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002c06a8;
  local_20._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002c06a8;
  local_28._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002c06a8;
  local_30._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002c01f8;
  local_38._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002c01f8;
  local_40._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002c01f8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_50);
  SimpleString::SimpleString(&local_60,"type1");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_50,&local_60,&local_18);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"type1");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_50,&local_60,&local_30);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"type2");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_50,&local_60,&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"type3");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_50,&local_60,&local_28);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"type2");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_50,&local_60,&local_38);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"type3");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_50,&local_60,&local_40);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type3");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_40,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x92,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type2");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_38,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x93,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type1");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_30,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x94,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type3");
  pMVar4 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_28,pMVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x95,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type2");
  pMVar4 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_20,pMVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x96,pTVar3);
  SimpleString::~SimpleString(&local_60);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"type1");
  pMVar4 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_50,&local_60);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_18,pMVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x97,pTVar3);
  SimpleString::~SimpleString(&local_60);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_50);
  return;
}

Assistant:

virtual void copy(void* dst_, const void* src_) _override
    {
        TypeForTestingExpectedFunctionCall* dst = (TypeForTestingExpectedFunctionCall*) dst_;
        const TypeForTestingExpectedFunctionCall* src = (const TypeForTestingExpectedFunctionCall*) src_;
        *(dst->value) = *(src->value);
    }